

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O2

int read_VXR(coda_cdf_product *product_file,coda_cdf_variable *variable,int64_t offset,int32_t first
            ,int32_t last)

{
  int iVar1;
  int iVar2;
  char cVar3;
  char cVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined3 uVar13;
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [11];
  undefined1 auVar30 [15];
  undefined1 auVar31 [11];
  undefined1 auVar32 [12];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  int iVar48;
  int iVar49;
  uint uVar50;
  int iVar51;
  int8_t *piVar52;
  int64_t *piVar53;
  bool bVar54;
  size_t __size;
  char *pcVar55;
  char *pcVar56;
  int64_t *offset_00;
  int64_t *byte_offset;
  long lVar57;
  long lVar58;
  int iVar59;
  long lVar60;
  int32_t last_00;
  uInt uVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined4 local_10c;
  int local_108;
  uint local_104;
  int64_t *local_100;
  long local_f8;
  int local_f0;
  int local_ec;
  int local_e8;
  int32_t record_type;
  int64_t *local_e0;
  int64_t *local_d8;
  ulong local_d0;
  long local_c8;
  ulong local_c0;
  int64_t csize;
  long local_b0;
  ulong local_a8;
  undefined1 local_a0 [80];
  voidpf local_50;
  undefined1 auVar68 [16];
  ulong uVar71;
  
  byte_offset = (int64_t *)(ulong)(uint)last;
  if (offset == 0) {
    return 0;
  }
  iVar48 = read_bytes(product_file->raw_product,offset + 8,4,&local_e8);
  if (iVar48 < 0) {
    return -1;
  }
  auVar62 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_e8 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_e8 >> 0x10),local_e8))
                                                  >> 0x20),local_e8) >> 0x18),
                                      (char)((uint)local_e8 >> 8)),(ushort)(byte)local_e8) &
                    0xffffff00ffffff);
  auVar62 = pshuflw(auVar62,auVar62,0x1b);
  sVar5 = auVar62._0_2_;
  sVar6 = auVar62._2_2_;
  sVar7 = auVar62._4_2_;
  sVar8 = auVar62._6_2_;
  local_e8 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar62[6] - (0xff < sVar8),
                      CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar62[4] - (0xff < sVar7),
                               CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar62[2] - (0xff < sVar6),
                                        (0 < sVar5) * (sVar5 < 0x100) * auVar62[0] - (0xff < sVar5))
                              ));
  if (local_e8 != 6) {
    pcVar56 = "CDF file has invalid record type (%d) for VXR record";
LAB_00142b4f:
    coda_set_error(-300,pcVar56);
    return -1;
  }
  iVar48 = read_bytes(product_file->raw_product,offset + 0xc,8,&local_c0);
  if (iVar48 < 0) {
    return -1;
  }
  iVar48 = read_bytes(product_file->raw_product,offset + 0x14,4,&local_104);
  if (iVar48 < 0) {
    return -1;
  }
  pcVar56 = (char *)&local_108;
  iVar48 = read_bytes(product_file->raw_product,offset + 0x18,4,pcVar56);
  if (iVar48 < 0) {
    return -1;
  }
  auVar15._8_6_ = 0;
  auVar15._0_8_ = local_c0;
  auVar15[0xe] = (char)(local_c0 >> 0x38);
  auVar17._8_4_ = 0;
  auVar17._0_8_ = local_c0;
  auVar17[0xc] = (char)(local_c0 >> 0x30);
  auVar17._13_2_ = auVar15._13_2_;
  auVar19._8_4_ = 0;
  auVar19._0_8_ = local_c0;
  auVar19._12_3_ = auVar17._12_3_;
  auVar21._8_2_ = 0;
  auVar21._0_8_ = local_c0;
  auVar21[10] = (char)(local_c0 >> 0x28);
  auVar21._11_4_ = auVar19._11_4_;
  auVar23._8_2_ = 0;
  auVar23._0_8_ = local_c0;
  auVar23._10_5_ = auVar21._10_5_;
  auVar25[8] = (char)(local_c0 >> 0x20);
  auVar25._0_8_ = local_c0;
  auVar25._9_6_ = auVar23._9_6_;
  auVar62[7] = 0;
  auVar62._0_7_ = auVar25._8_7_;
  auVar28._7_8_ = 0;
  auVar28._0_7_ = auVar25._8_7_;
  auVar33._1_8_ = SUB158(auVar28 << 0x40,7);
  auVar33[0] = (char)(local_c0 >> 0x18);
  auVar33._9_6_ = 0;
  auVar29._1_10_ = SUB1510(auVar33 << 0x30,5);
  auVar29[0] = (char)(local_c0 >> 0x10);
  auVar34._11_4_ = 0;
  auVar34._0_11_ = auVar29;
  auVar27._3_12_ = SUB1512(auVar34 << 0x20,3);
  auVar27[2] = (char)(local_c0 >> 8);
  auVar27[1] = 0;
  auVar27[0] = (byte)local_c0;
  auVar62._8_4_ = auVar27._0_4_;
  auVar62._12_4_ = auVar29._0_4_;
  auVar62 = pshuflw(auVar62,auVar62,0x1b);
  auVar62 = pshufhw(auVar62,auVar62,0x1b);
  sVar5 = auVar62._0_2_;
  sVar6 = auVar62._2_2_;
  sVar7 = auVar62._4_2_;
  sVar8 = auVar62._6_2_;
  sVar9 = auVar62._8_2_;
  sVar10 = auVar62._10_2_;
  sVar11 = auVar62._12_2_;
  sVar12 = auVar62._14_2_;
  cVar3 = (0 < sVar12) * (sVar12 < 0x100) * auVar62[0xe] - (0xff < sVar12);
  local_c0 = CONCAT17(cVar3,CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar62[0xc] -
                                     (0xff < sVar11),
                                     CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar62[10] -
                                              (0xff < sVar10),
                                              CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar62[8] -
                                                       (0xff < sVar9),
                                                       CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                                auVar62[6] - (0xff < sVar8),
                                                                CONCAT12((0 < sVar7) *
                                                                         (sVar7 < 0x100) *
                                                                         auVar62[4] - (0xff < sVar7)
                                                                         ,CONCAT11((0 < sVar6) *
                                                                                   (sVar6 < 0x100) *
                                                                                   auVar62[2] -
                                                                                   (0xff < sVar6),
                                                                                   (0 < sVar5) *
                                                                                   (sVar5 < 0x100) *
                                                                                   auVar62[0] -
                                                                                   (0xff < sVar5))))
                                                      ))));
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(
                                                  local_104 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(local_104 >> 0x10),local_104)) >>
                                                  0x20),local_104) >> 0x18),
                                       CONCAT12((char)(local_104 >> 8),(short)local_104)) >> 0x10),
                       (short)local_104) & 0xffff00ff00ff00ff;
  auVar62 = pshuflw(auVar63,auVar63,0x1b);
  sVar5 = auVar62._0_2_;
  sVar6 = auVar62._2_2_;
  sVar7 = auVar62._4_2_;
  sVar8 = auVar62._6_2_;
  cVar4 = (0 < sVar8) * (sVar8 < 0x100) * auVar62[6] - (0xff < sVar8);
  local_104 = CONCAT13(cVar4,CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar62[4] - (0xff < sVar7),
                                      CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar62[2] -
                                               (0xff < sVar6),
                                               (0 < sVar5) * (sVar5 < 0x100) * auVar62[0] -
                                               (0xff < sVar5))));
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       (ulong)CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)
                                                  local_108 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_108 >> 0x10),local_108
                                                          )) >> 0x20),local_108) >> 0x18),
                                (char)((uint)local_108 >> 8)),(ushort)(byte)local_108) &
       0xffff00ff00ffffff;
  auVar62 = pshuflw(auVar64,auVar64,0x1b);
  sVar5 = auVar62._0_2_;
  sVar6 = auVar62._2_2_;
  sVar7 = auVar62._4_2_;
  sVar8 = auVar62._6_2_;
  local_108 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar62[6] - (0xff < sVar8),
                       CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar62[4] - (0xff < sVar7),
                                CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar62[2] - (0xff < sVar6)
                                         ,(0 < sVar5) * (sVar5 < 0x100) * auVar62[0] -
                                          (0xff < sVar5))));
  if ((cVar3 < '\0') || (product_file->file_size <= (long)local_c0)) {
    pcVar56 = "CDF file has invalid offset for VXR record";
  }
  else {
    local_a8 = (ulong)local_104;
    if (cVar4 < '\0') {
      pcVar56 = "CDF file has invalid number of entries for VXR record";
    }
    else {
      lVar58 = offset + 0x1c;
      local_b0 = (long)local_108;
      iVar48 = -1;
      lVar60 = 0;
      local_d0 = local_c0;
      while( true ) {
        if (local_b0 <= lVar60) {
          iVar48 = read_VXR(product_file,variable,local_d0,(int32_t)pcVar56,(int32_t)byte_offset);
          return -(uint)(iVar48 != 0);
        }
        local_c8 = lVar60;
        iVar49 = read_bytes(product_file->raw_product,lVar58 + lVar60 * 4,4,&local_ec);
        if (iVar49 < 0) {
          return -1;
        }
        iVar59 = (int)local_a8 + (int)local_c8;
        iVar49 = read_bytes(product_file->raw_product,iVar59 * 4 + lVar58,4,&local_10c);
        if (iVar49 < 0) {
          return -1;
        }
        iVar49 = read_bytes(product_file->raw_product,iVar59 * 8 + lVar58,8,&local_d8);
        if (iVar49 < 0) {
          return -1;
        }
        auVar62 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)local_ec >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_ec >> 0x10),local_ec))
                                                  >> 0x20),local_ec) >> 0x18),
                                            (char)((uint)local_ec >> 8)),(ushort)(byte)local_ec) &
                          0xffffff00ffffff);
        auVar62 = pshuflw(auVar62,auVar62,0x1b);
        sVar5 = auVar62._0_2_;
        sVar6 = auVar62._2_2_;
        sVar7 = auVar62._4_2_;
        sVar8 = auVar62._6_2_;
        iVar49 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar62[6] - (0xff < sVar8),
                          CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar62[4] - (0xff < sVar7),
                                   CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar62[2] -
                                            (0xff < sVar6),
                                            (0 < sVar5) * (sVar5 < 0x100) * auVar62[0] -
                                            (0xff < sVar5))));
        auVar65._8_8_ = 0;
        auVar65._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)local_10c >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)local_10c >> 0x10),local_10c
                                                          )) >> 0x20),local_10c) >> 0x18),
                                             CONCAT12((char)((uint)local_10c >> 8),(short)local_10c)
                                            ) >> 0x10),(short)local_10c) & 0xffff00ff00ff00ff;
        auVar62 = pshuflw(auVar65,auVar65,0x1b);
        sVar5 = auVar62._0_2_;
        sVar6 = auVar62._2_2_;
        sVar7 = auVar62._4_2_;
        sVar8 = auVar62._6_2_;
        cVar3 = (0 < sVar8) * (sVar8 < 0x100) * auVar62[6] - (0xff < sVar8);
        local_10c = CONCAT13(cVar3,CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar62[4] -
                                            (0xff < sVar7),
                                            CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar62[2] -
                                                     (0xff < sVar6),
                                                     (0 < sVar5) * (sVar5 < 0x100) * auVar62[0] -
                                                     (0xff < sVar5))));
        auVar14._8_6_ = 0;
        auVar14._0_8_ = local_d8;
        auVar14[0xe] = (char)((ulong)local_d8 >> 0x38);
        auVar16._8_4_ = 0;
        auVar16._0_8_ = local_d8;
        auVar16[0xc] = (char)((ulong)local_d8 >> 0x30);
        auVar16._13_2_ = auVar14._13_2_;
        auVar18._8_4_ = 0;
        auVar18._0_8_ = local_d8;
        auVar18._12_3_ = auVar16._12_3_;
        auVar20._8_2_ = 0;
        auVar20._0_8_ = local_d8;
        auVar20[10] = (char)((ulong)local_d8 >> 0x28);
        auVar20._11_4_ = auVar18._11_4_;
        auVar22._8_2_ = 0;
        auVar22._0_8_ = local_d8;
        auVar22._10_5_ = auVar20._10_5_;
        auVar24[8] = (char)((ulong)local_d8 >> 0x20);
        auVar24._0_8_ = local_d8;
        auVar24._9_6_ = auVar22._9_6_;
        auVar66[7] = 0;
        auVar66._0_7_ = auVar24._8_7_;
        auVar30._7_8_ = 0;
        auVar30._0_7_ = auVar24._8_7_;
        auVar35._1_8_ = SUB158(auVar30 << 0x40,7);
        auVar35[0] = (char)((ulong)local_d8 >> 0x18);
        auVar35._9_6_ = 0;
        auVar31._1_10_ = SUB1510(auVar35 << 0x30,5);
        auVar31[0] = (char)((ulong)local_d8 >> 0x10);
        auVar36._11_4_ = 0;
        auVar36._0_11_ = auVar31;
        auVar26._3_12_ = SUB1512(auVar36 << 0x20,3);
        auVar26[2] = (char)((ulong)local_d8 >> 8);
        auVar26[1] = 0;
        auVar26[0] = (byte)local_d8;
        auVar66._8_4_ = auVar26._0_4_;
        auVar66._12_4_ = auVar31._0_4_;
        auVar62 = pshuflw(auVar66,auVar66,0x1b);
        auVar62 = pshufhw(auVar62,auVar62,0x1b);
        sVar5 = auVar62._0_2_;
        sVar6 = auVar62._2_2_;
        sVar7 = auVar62._4_2_;
        sVar8 = auVar62._6_2_;
        last_00 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar62[6] - (0xff < sVar8),
                           CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar62[4] - (0xff < sVar7),
                                    CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar62[2] -
                                             (0xff < sVar6),
                                             (0 < sVar5) * (sVar5 < 0x100) * auVar62[0] -
                                             (0xff < sVar5))));
        sVar5 = auVar62._8_2_;
        sVar6 = auVar62._10_2_;
        sVar7 = auVar62._12_2_;
        sVar8 = auVar62._14_2_;
        cVar4 = (0 < sVar8) * (sVar8 < 0x100) * auVar62[0xe] - (0xff < sVar8);
        offset_00 = (int64_t *)
                    CONCAT17(cVar4,CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar62[0xc] -
                                            (0xff < sVar7),
                                            CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar62[10] -
                                                     (0xff < sVar6),
                                                     CONCAT14((0 < sVar5) * (sVar5 < 0x100) *
                                                              auVar62[8] - (0xff < sVar5),last_00)))
                            );
        lVar60 = (long)iVar49;
        local_ec = iVar49;
        local_d8 = offset_00;
        if (lVar60 < 0) break;
        if (cVar3 < '\0') {
          pcVar56 = "CDF file has invalid last record number in VXR record";
          goto LAB_00142b76;
        }
        if ((cVar4 < '\0') || (product_file->file_size <= (long)offset_00)) {
          pcVar56 = "CDF file has invalid offset for VR record";
          goto LAB_00142b76;
        }
        pcVar56 = (char *)offset_00;
        if (offset_00 != (int64_t *)0x0) {
          local_f8 = CONCAT44(local_f8._4_4_,local_10c);
          pcVar56 = (char *)&record_type;
          local_f0 = iVar49;
          iVar59 = read_bytes(product_file->raw_product,(int64_t)(offset_00 + 1),4,pcVar56);
          if (iVar59 < 0) {
            return -1;
          }
          auVar39._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
          auVar39[0] = (char)((uint)record_type >> 0x18);
          auVar39._10_6_ = 0;
          auVar68._5_11_ = SUB1611(auVar39 << 0x30,5);
          auVar68[4] = (char)((uint)record_type >> 0x10);
          auVar68._0_4_ = record_type;
          auVar38._12_4_ = 0;
          auVar38._0_12_ = auVar68._4_12_;
          auVar67._3_13_ = SUB1613(auVar38 << 0x20,3);
          auVar67[2] = (char)((uint)record_type >> 8);
          auVar67[0] = (byte)record_type;
          auVar67[1] = 0;
          auVar62 = pshuflw(auVar67,auVar67,0x1b);
          sVar5 = auVar62._0_2_;
          sVar6 = auVar62._2_2_;
          sVar7 = auVar62._4_2_;
          sVar8 = auVar62._6_2_;
          record_type = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar62[6] - (0xff < sVar8),
                                 CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar62[4] -
                                          (0xff < sVar7),
                                          CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar62[2] -
                                                   (0xff < sVar6),
                                                   (0 < sVar5) * (sVar5 < 0x100) * auVar62[0] -
                                                   (0xff < sVar5))));
          if (record_type == 0xd) {
            if (variable->has_compression == 0) {
              iVar49 = -0x16;
              pcVar55 = "unexpected CVVR record for uncompressed CDF variable";
              pcVar56 = (char *)offset_00;
LAB_001428b7:
              coda_set_error(iVar49,pcVar55);
              iVar59 = iVar48;
            }
            else {
              uVar50 = variable->num_records;
              pcVar56 = (char *)offset_00;
              iVar59 = 0;
              if ((int)uVar50 <= iVar49) goto LAB_001428c0;
              if (variable->data == (int8_t *)0x0) {
                local_100 = (int64_t *)(long)variable->num_values_per_record;
                local_e0 = (int64_t *)(long)variable->value_size;
                piVar52 = (int8_t *)malloc((long)local_100 * (long)local_e0 * (long)(int)uVar50);
                variable->data = piVar52;
                if (piVar52 != (int8_t *)0x0) goto LAB_00142819;
                __size = (long)local_100 * (ulong)uVar50 * (long)local_e0;
                byte_offset = (int64_t *)0x2c9;
LAB_001429d1:
                pcVar56 = 
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                ;
                coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size);
                iVar59 = iVar48;
              }
              else {
LAB_00142819:
                uVar50 = read_bytes(product_file->raw_product,(int64_t)(offset_00 + 2),8,&csize);
                pcVar56 = (char *)(ulong)uVar50;
                iVar59 = iVar48;
                if (-1 < (int)uVar50) {
                  auVar37._8_6_ = 0;
                  auVar37._0_8_ = csize;
                  auVar37[0xe] = (char)((ulong)csize >> 0x38);
                  auVar43._8_4_ = 0;
                  auVar43._0_8_ = csize;
                  auVar43[0xc] = (char)((ulong)csize >> 0x30);
                  auVar43._13_2_ = auVar37._13_2_;
                  auVar44._8_4_ = 0;
                  auVar44._0_8_ = csize;
                  auVar44._12_3_ = auVar43._12_3_;
                  auVar45._8_2_ = 0;
                  auVar45._0_8_ = csize;
                  auVar45[10] = (char)((ulong)csize >> 0x28);
                  auVar45._11_4_ = auVar44._11_4_;
                  auVar46._8_2_ = 0;
                  auVar46._0_8_ = csize;
                  auVar46._10_5_ = auVar45._10_5_;
                  auVar47[8] = (char)((ulong)csize >> 0x20);
                  auVar47._0_8_ = csize;
                  auVar47._9_6_ = auVar46._9_6_;
                  uVar71 = CONCAT17(0,auVar47._8_7_);
                  auVar42._8_8_ = 0;
                  auVar42._0_8_ = uVar71;
                  auVar41._1_9_ = SUB169(auVar42 << 0x40,7);
                  auVar41[0] = (char)((ulong)csize >> 0x18);
                  auVar41._10_6_ = 0;
                  auVar32._1_11_ = SUB1611(auVar41 << 0x30,5);
                  auVar32[0] = (char)((ulong)csize >> 0x10);
                  auVar40._12_4_ = 0;
                  auVar40._0_12_ = auVar32;
                  auVar69._3_13_ = SUB1613(auVar40 << 0x20,3);
                  auVar69[2] = (char)((ulong)csize >> 8);
                  auVar69[0] = (byte)csize;
                  auVar69[1] = 0;
                  auVar70._8_4_ = auVar69._0_4_;
                  auVar70._0_8_ = uVar71;
                  auVar70._12_4_ = auVar32._0_4_;
                  auVar62 = pshuflw(auVar70,auVar70,0x1b);
                  auVar62 = pshufhw(auVar62,auVar62,0x1b);
                  sVar5 = auVar62._0_2_;
                  sVar6 = auVar62._2_2_;
                  sVar7 = auVar62._4_2_;
                  sVar8 = auVar62._6_2_;
                  uVar61 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar62[6] - (0xff < sVar8),
                                    CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar62[4] -
                                             (0xff < sVar7),
                                             CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar62[2] -
                                                      (0xff < sVar6),
                                                      (0 < sVar5) * (sVar5 < 0x100) * auVar62[0] -
                                                      (0xff < sVar5))));
                  sVar5 = auVar62._8_2_;
                  sVar6 = auVar62._10_2_;
                  sVar7 = auVar62._12_2_;
                  sVar8 = auVar62._14_2_;
                  __size = CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar62[0xe] - (0xff < sVar8),
                                    CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar62[0xc] -
                                             (0xff < sVar7),
                                             CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar62[10] -
                                                      (0xff < sVar6),
                                                      CONCAT14((0 < sVar5) * (sVar5 < 0x100) *
                                                               auVar62[8] - (0xff < sVar5),uVar61)))
                                   );
                  csize = __size;
                  if ((long)__size < 0x14) {
                    iVar49 = -300;
                    pcVar55 = "invalid compressed data block for CDF variable";
                    goto LAB_001428b7;
                  }
                  piVar53 = (int64_t *)malloc(__size);
                  if (piVar53 == (int64_t *)0x0) {
                    byte_offset = (int64_t *)0x2e0;
                    goto LAB_001429d1;
                  }
                  pcVar56 = (char *)piVar53;
                  iVar49 = read_bytes(product_file->raw_product,(int64_t)(offset_00 + 3),__size,
                                      piVar53);
                  if (-1 < iVar49) {
                    local_a0._0_8_ = (int64_t *)0x0;
                    local_a0._8_4_ = 0;
                    local_a0._48_8_ = (char *)0x0;
                    local_a0._64_16_ = (undefined1  [16])0x0;
                    local_50 = (voidpf)0x0;
                    pcVar56 = (char *)0x70;
                    iVar49 = coda_inflateInit2_((z_streamp)local_a0,0x1f,"1.3.1",0x70);
                    if (iVar49 == 0) {
                      iVar49 = variable->num_records;
                      iVar59 = iVar49 + -1;
                      if ((int)local_f8 < iVar49) {
                        iVar59 = (int)local_f8;
                      }
                      iVar51 = variable->value_size * variable->num_values_per_record;
                      local_a0._32_4_ = ((iVar59 - local_f0) + 1) * iVar51;
                      local_a0._24_8_ = variable->data + iVar51 * local_f0;
                      local_100 = piVar53;
                      local_a0._0_8_ = piVar53;
                      local_a0._8_4_ = uVar61;
                      iVar51 = coda_inflate((z_streamp)local_a0,4);
                      if (iVar51 == -2) {
                        __assert_fail("result != Z_STREAM_ERROR",
                                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                                      ,0x303,
                                      "int read_VR(coda_cdf_product *, coda_cdf_variable *, int64_t, int32_t, int32_t)"
                                     );
                      }
                      uVar13 = (undefined3)((ulong)local_f8 >> 8);
                      pcVar56 = (char *)(ulong)CONCAT31(uVar13,iVar49 <= (int)local_f8);
                      if ((-1 < iVar51) ||
                         (bVar54 = iVar49 <= (int)local_f8 && iVar51 == -5,
                         pcVar56 = (char *)(ulong)CONCAT31(uVar13,bVar54), bVar54)) {
                        free(local_100);
                        iVar49 = coda_inflateEnd((z_streamp)local_a0);
                        if (iVar49 == 0) {
                          for (; (int)lVar60 <= iVar59; lVar60 = lVar60 + 1) {
                            pcVar56 = (char *)variable->offset;
                            *(long *)((long)pcVar56 + lVar60 * 8) =
                                 (long)variable->value_size *
                                 (long)(int)lVar60 * (long)variable->num_values_per_record;
                          }
                          goto LAB_001428cd;
                        }
                        coda_set_error(-0x16,"zlib error");
                        iVar59 = iVar48;
                        if ((char *)local_a0._48_8_ != (char *)0x0) {
                          coda_add_error_message(" (%s)");
                        }
                        goto LAB_001428c0;
                      }
                      if (iVar51 == -4) {
                        coda_set_error(-1,(char *)0x0);
                      }
                      else {
                        if (iVar51 == -3) {
                          pcVar55 = "invalid or incomplete compressed data for CDF variable";
                        }
                        else {
                          pcVar55 = "error during decompression of CDF variable";
                        }
                        coda_set_error(-0x16,pcVar55);
                        if ((char *)local_a0._48_8_ != (char *)0x0) {
                          coda_add_error_message(" (%s)");
                        }
                      }
                      coda_inflateEnd((z_streamp)local_a0);
                      piVar53 = local_100;
                    }
                    else {
                      coda_set_error(-0x16,"could not intialize zip decompression");
                      if ((char *)local_a0._48_8_ != (char *)0x0) {
                        coda_add_error_message(" (%s)");
                      }
                    }
                  }
                  free(piVar53);
                  iVar59 = iVar48;
                }
              }
            }
          }
          else {
            if (record_type == 7) {
              iVar59 = variable->num_records;
              pcVar56 = (char *)(long)iVar59;
              iVar51 = iVar59 + -1;
              if ((int)local_f8 < iVar59) {
                iVar51 = (int)local_f8;
              }
              if (variable->has_compression == 0) {
                byte_offset = (int64_t *)((long)offset_00 + 0xc);
                iVar49 = 0;
                for (; (int)lVar60 <= iVar51; lVar60 = lVar60 + 1) {
                  pcVar56 = (char *)variable->offset;
                  *(int64_t **)((long)pcVar56 + lVar60 * 8) =
                       (int64_t *)
                       ((long)variable->value_size *
                        (long)variable->num_values_per_record * (long)iVar49 + (long)byte_offset);
                  iVar49 = iVar49 + 1;
                }
              }
              else {
                piVar52 = variable->data;
                iVar1 = variable->num_values_per_record;
                iVar2 = variable->value_size;
                piVar53 = (int64_t *)(long)iVar2;
                lVar57 = (long)iVar1;
                if (piVar52 == (int8_t *)0x0) {
                  local_100 = (int64_t *)(long)iVar2;
                  local_f8 = (long)iVar1;
                  local_e0 = (int64_t *)pcVar56;
                  piVar52 = (int8_t *)malloc((long)(iVar59 * iVar1 * iVar2));
                  variable->data = piVar52;
                  piVar53 = local_100;
                  lVar57 = local_f8;
                  if (piVar52 == (int8_t *)0x0) {
                    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                                   local_f8 * (long)local_e0 * (long)local_100,
                                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                                   ,0x295);
                    return -1;
                  }
                }
                byte_offset = (int64_t *)((long)offset_00 + 0xc);
                iVar59 = (int)lVar57 * (int)piVar53;
                pcVar56 = piVar52 + iVar59 * iVar49;
                iVar49 = read_bytes(product_file->raw_product,(int64_t)byte_offset,
                                    (long)(((iVar51 - local_f0) + 1) * iVar59),pcVar56);
                if (iVar49 < 0) {
                  return -1;
                }
                for (; (int)lVar60 <= iVar51; lVar60 = lVar60 + 1) {
                  pcVar56 = (char *)variable->offset;
                  *(long *)((long)pcVar56 + lVar60 * 8) =
                       (long)variable->value_size *
                       (long)(int)lVar60 * (long)variable->num_values_per_record;
                }
              }
              goto LAB_001428cd;
            }
            if (record_type != 6) {
              pcVar56 = "CDF file has invalid record type (%d) for VVR record";
              goto LAB_00142b4f;
            }
            iVar59 = read_VXR(product_file,variable,(int64_t)offset_00,(int32_t)pcVar56,last_00);
            byte_offset = offset_00;
          }
LAB_001428c0:
          if (iVar59 != 0) {
            return -1;
          }
        }
LAB_001428cd:
        lVar60 = local_c8 + 1;
      }
      pcVar56 = "CDF file has invalid first record number in VXR record";
    }
  }
LAB_00142b76:
  coda_set_error(-300,pcVar56);
  return -1;
}

Assistant:

static int read_VXR(coda_cdf_product *product_file, coda_cdf_variable *variable, int64_t offset, int32_t first,
                    int32_t last)
{
    int32_t record_type;
    int64_t vxr_next;
    int32_t n_entries;
    int32_t nused_entries;
    int i;

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (record_type != 6)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for VXR record", record_type);
        return -1;
    }

    if (read_bytes(product_file->raw_product, offset + 12, 8, &vxr_next) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 20, 4, &n_entries) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 24, 4, &nused_entries) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int64(&vxr_next);
    swap_int32(&n_entries);
    swap_int32(&nused_entries);
#endif
    offset += 28;
    if (vxr_next < 0 || vxr_next >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VXR record");
        return -1;
    }
    if (n_entries < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of entries for VXR record");
        return -1;
    }

    for (i = 0; i < nused_entries; i++)
    {
        int32_t vr_first;
        int32_t vr_last;
        int64_t vr_offset;

        if (read_bytes(product_file->raw_product, offset + i * 4, 4, &vr_first) < 0)
        {
            return -1;
        }
        if (read_bytes(product_file->raw_product, offset + (i + n_entries) * 4, 4, &vr_last) < 0)
        {
            return -1;
        }
        if (read_bytes(product_file->raw_product, offset + (i + n_entries) * 8, 8, &vr_offset) < 0)
        {
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_int32(&vr_first);
        swap_int32(&vr_last);
        swap_int64(&vr_offset);
#endif
        if (vr_first < 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid first record number in VXR record");
            return -1;
        }
        if (vr_last < 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid last record number in VXR record");
            return -1;
        }
        if (vr_offset < 0 || vr_offset >= product_file->file_size)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VR record");
            return -1;
        }
        if (read_VR(product_file, variable, vr_offset, vr_first, vr_last) != 0)
        {
            return -1;
        }
    }

    if (read_VXR(product_file, variable, vxr_next, first, last) != 0)
    {
        return -1;
    }

    return 0;
}